

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O1

uint32_t farmhash32_with_seed(char *s,size_t len,uint32_t seed)

{
  uint uVar1;
  uint64_t uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar2 = farmhash64_te_with_seed(s,len,(ulong)seed);
  uVar3 = (int)uVar2 * -0x3361d2af;
  uVar4 = 0x18;
  lVar5 = 0;
  uVar6 = 0x18;
  uVar1 = uVar3;
  do {
    uVar7 = 0xff << (uVar4 & 0x1f);
    uVar8 = 0xff << ((uint)lVar5 & 0x1f);
    uVar1 = ~(uVar7 | uVar8) & uVar1 |
            (uVar7 & uVar3) >> (uVar6 & 0x1f) | (uVar8 & uVar3) << (uVar6 & 0x1f);
    lVar5 = lVar5 + 8;
    uVar6 = uVar6 - 0x10;
    uVar4 = uVar4 - 8;
  } while (lVar5 == 8);
  return ~uVar1;
}

Assistant:

uint32_t farmhash32_with_seed(const char* s, size_t len, uint32_t seed) {
  return debug_tweak32(

#if CAN_USE_SSE41 && x86_64
      farmhash32_nt_with_seed(s, len, seed)
#elif CAN_USE_SSE42 && CAN_USE_AESNI
      farmhash32_su_with_seed(s, len, seed)
#elif CAN_USE_SSE41 && CAN_USE_SSE42
      farmhash32_sa_with_seed(s, len, seed)
#else
      farmhash32_mk_with_seed(s, len, seed)
#endif

  );
}